

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O3

bool Gudhi::persistence_matrix::operator<
               (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_>_>
                *c1,Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_>_>
                    *c2)

{
  node_ptr plVar1;
  node_ptr plVar2;
  Column_support *pCVar3;
  bool bVar4;
  
  if (c1 == c2) {
    return false;
  }
  pCVar3 = &c2->column_;
  plVar1 = (node_ptr)pCVar3;
  plVar2 = (node_ptr)&c1->column_;
  do {
    plVar2 = (((type *)&plVar2->next_)->data_).root_plus_size_.m_header.super_node.next_;
    plVar1 = (((type *)&plVar1->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if ((plVar2 == (node_ptr)&c1->column_) || (plVar1 == (node_ptr)pCVar3)) {
      return plVar1 != (node_ptr)pCVar3;
    }
    bVar4 = *(uint *)&plVar2[1].next_ < *(uint *)&plVar1[1].next_;
  } while ((*(uint *)&plVar2[1].next_ == *(uint *)&plVar1[1].next_) &&
          (bVar4 = *(uint *)&plVar2[-1].prev_ < *(uint *)&plVar1[-1].prev_,
          *(uint *)&plVar2[-1].prev_ == *(uint *)&plVar1[-1].prev_));
  return bVar4;
}

Assistant:

bool operator<(const Intrusive_list_column& c1, const Intrusive_list_column& c2) {
    if (&c1 == &c2) return false;

    if constexpr (Master_matrix::Option_list::is_z2) {
      return c1.column_ < c2.column_;
    } else {
      auto it1 = c1.column_.begin();
      auto it2 = c2.column_.begin();
      while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
        if (it1->get_row_index() != it2->get_row_index()) return it1->get_row_index() < it2->get_row_index();
        if (it1->get_element() != it2->get_element()) return it1->get_element() < it2->get_element();
        ++it1;
        ++it2;
      }
      return it2 != c2.column_.end();
    }
  }